

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1c5214::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  int iVar1;
  EImageType in_ECX;
  byte in_R8B;
  Array2D<Imath_3_2::half> lPixelsLeft;
  Array2D<Imath_3_2::half> lPixels;
  int lNbChannels;
  Array2D<Imath_3_2::half> *in_stack_000000a0;
  int in_stack_000000ac;
  char *in_stack_000000b0;
  Array2D<Imath_3_2::half> *in_stack_000000e8;
  Array2D<Imath_3_2::half> *in_stack_000000f0;
  int in_stack_000000fc;
  char *in_stack_00000100;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffa0;
  half *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffd0;
  half *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = getNbChannels(in_ECX);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D((Array2D<Imath_3_2::half> *)&stack0xffffffffffffffc8);
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(long)in_stack_ffffffffffffffb0);
  if ((in_R8B & 1) == 0) {
    readPixels(in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
    validatePixels((int *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(int *)in_stack_ffffffffffffffd8
                   ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                   (bool)in_stack_ffffffffffffffcb);
  }
  else {
    Imf_3_2::Array2D<Imath_3_2::half>::Array2D((Array2D<Imath_3_2::half> *)&stack0xffffffffffffffa0)
    ;
    Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(long)in_stack_ffffffffffffffb0);
    readPixels(in_stack_00000100,in_stack_000000fc,in_stack_000000f0,in_stack_000000e8);
    validatePixels((int *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(int *)in_stack_ffffffffffffffd8
                   ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                   (bool)in_stack_ffffffffffffffcb);
    validatePixels((int *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(int *)in_stack_ffffffffffffffd8
                   ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                   (bool)in_stack_ffffffffffffffcb);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffffa0);
  }
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void
readValidateFile (
    const char pFilename[],
    int        pHeight,
    int        pWidth,
    EImageType pImageType,
    bool       pIsStereo)
{
    const int lNbChannels = getNbChannels (pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}